

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O2

void vkt::ubo::anon_unknown_0::createBlockBasicTypeCases
               (TestCaseGroup *group,TestContext *testCtx,string *name,VarType *type,
               deUint32 layoutFlags,int numInstances)

{
  uint layoutFlags_00;
  TestNode *pTVar1;
  undefined4 in_register_0000008c;
  allocator<char> local_99;
  TestNode *local_98;
  TestContext *local_90;
  undefined8 local_88;
  string *local_80;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint local_34;
  
  local_88 = CONCAT44(in_register_0000008c,numInstances);
  local_98 = &group->super_TestNode;
  local_90 = testCtx;
  pTVar1 = (TestNode *)operator_new(0x168);
  local_80 = name;
  std::operator+(&local_58,name,"_vertex");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_99);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,local_90,&local_58,&local_78,type,layoutFlags | 0x200,
             (int)local_88,LOAD_FULL_MATRIX);
  tcu::TestNode::addChild(local_98,pTVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = (TestNode *)operator_new(0x168);
  std::operator+(&local_58,local_80,"_fragment");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_99);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,local_90,&local_58,&local_78,type,layoutFlags | 0x400,
             (int)local_88,LOAD_FULL_MATRIX);
  tcu::TestNode::addChild(local_98,pTVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = (TestNode *)operator_new(0x168);
  std::operator+(&local_58,local_80,"_both");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_99);
  local_34 = layoutFlags | 0x600;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,local_90,&local_58,&local_78,type,local_34,(int)local_88,
             LOAD_FULL_MATRIX);
  tcu::TestNode::addChild(local_98,pTVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = (TestNode *)operator_new(0x168);
  std::operator+(&local_58,local_80,"_vertex_comp_access");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_99);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,local_90,&local_58,&local_78,type,layoutFlags | 0x200,
             (int)local_88,LOAD_MATRIX_COMPONENTS);
  tcu::TestNode::addChild(local_98,pTVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = (TestNode *)operator_new(0x168);
  std::operator+(&local_58,local_80,"_fragment_comp_access");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_99);
  layoutFlags_00 = local_34;
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,local_90,&local_58,&local_78,type,layoutFlags | 0x400,
             (int)local_88,LOAD_MATRIX_COMPONENTS);
  tcu::TestNode::addChild(local_98,pTVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = (TestNode *)operator_new(0x168);
  std::operator+(&local_58,local_80,"_both_comp_access");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_99);
  BlockBasicTypeCase::BlockBasicTypeCase
            ((BlockBasicTypeCase *)pTVar1,local_90,&local_58,&local_78,type,layoutFlags_00,
             (int)local_88,LOAD_MATRIX_COMPONENTS);
  tcu::TestNode::addChild(local_98,pTVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

static void createBlockBasicTypeCases (tcu::TestCaseGroup* group, tcu::TestContext& testCtx, const std::string& name, const VarType& type, deUint32 layoutFlags, int numInstances = 0)
{
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_vertex",			"", type, layoutFlags|DECLARE_VERTEX,						numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_fragment",			"", type, layoutFlags|DECLARE_FRAGMENT,						numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_both",				"",	type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,		numInstances, LOAD_FULL_MATRIX));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_vertex_comp_access",		"", type, layoutFlags|DECLARE_VERTEX,				numInstances, LOAD_MATRIX_COMPONENTS));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_fragment_comp_access",	"", type, layoutFlags|DECLARE_FRAGMENT,					numInstances, LOAD_MATRIX_COMPONENTS));
	group->addChild(new BlockBasicTypeCase(testCtx, name + "_both_comp_access",		"",	type, layoutFlags|DECLARE_VERTEX|DECLARE_FRAGMENT,	numInstances, LOAD_MATRIX_COMPONENTS));
}